

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundfiles.c
# Opt level: O0

int ps_config_nistfile(ps_config_t *config,FILE *infh,char *file)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  int local_43c;
  int rv;
  char *c;
  char *line;
  char hdr [1024];
  char *file_local;
  FILE *infh_local;
  ps_config_t *config_local;
  
  local_43c = 0;
  sVar3 = fread(&line,1,0x400,(FILE *)infh);
  if (sVar3 == 0x400) {
    hdr[0x3f7] = '\0';
    pcVar4 = strstr((char *)&line,"sample_rate");
    if (pcVar4 == (char *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
              ,0xee,"No sampling rate in NIST header!\n");
      local_43c = -1;
    }
    else {
      pcVar5 = strchr(pcVar4,10);
      if (pcVar5 != (char *)0x0) {
        *pcVar5 = '\0';
      }
      pcVar5 = strrchr(pcVar4,0x20);
      if (pcVar5 == (char *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                ,0xf6,"Could not find sampling rate!\n");
        local_43c = -1;
      }
      else {
        pcVar5 = pcVar5 + 1;
        lVar6 = ps_config_int(config,"samprate");
        if (lVar6 == 0) {
          iVar1 = atoi(pcVar5);
          ps_config_set_int(config,"samprate",(long)iVar1);
        }
        else {
          lVar6 = ps_config_int(config,"samprate");
          iVar1 = atoi(pcVar5);
          if (lVar6 != iVar1) {
            uVar2 = atoi(pcVar5);
            lVar6 = ps_config_int(config,"samprate");
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                    ,0xff,"NIST file sampling rate %d != samprate %d\n",(ulong)uVar2,lVar6);
          }
        }
        sVar3 = strlen(pcVar4);
        if (pcVar4 + sVar3 < hdr + 0x3f7) {
          sVar3 = strlen(pcVar4);
          pcVar4[sVar3] = ' ';
        }
        pcVar4 = strstr((char *)&line,"sample_byte_format");
        if (pcVar4 == (char *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                  ,0x105,"No sample byte format in NIST header!\n");
          local_43c = -1;
        }
        else {
          pcVar5 = strchr(pcVar4,10);
          if (pcVar5 != (char *)0x0) {
            *pcVar5 = '\0';
          }
          pcVar4 = strrchr(pcVar4,0x20);
          if (pcVar4 == (char *)0x0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                    ,0x10d,"Could not find sample byte order!\n");
            local_43c = -1;
          }
          else {
            pcVar4 = pcVar4 + 1;
            iVar1 = memcmp(pcVar4,"01",2);
            if (iVar1 == 0) {
              ps_config_set_str(config,"input_endian","little");
            }
            else {
              iVar1 = memcmp(pcVar4,"10",2);
              if (iVar1 == 0) {
                ps_config_set_str(config,"input_endian","big");
              }
              else {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                        ,0x119,"Unknown byte order %s\n",pcVar4);
                local_43c = -1;
              }
            }
          }
        }
      }
    }
  }
  else {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                   ,0xe8,"Failed to read %d bytes",0x400);
    local_43c = -1;
  }
  return local_43c;
}

Assistant:

int
ps_config_nistfile(ps_config_t *config, FILE *infh, const char *file)
{
    char hdr[1024];
    char *line, *c;
    int rv = 0;

    if (file == NULL)
        file = "(input filehandle)";

    TRY_FREAD(hdr, 1, 1024, infh);
    hdr[1023] = '\0';

    /* Roughly parse it to find the sampling rate and byte order
     * (don't bother with other stuff) */
    if ((line = strstr(hdr, "sample_rate")) == NULL) {
        E_ERROR("No sampling rate in NIST header!\n");
        rv = -1;
        goto error_out;
    }
    c = strchr(line, '\n');
    if (c) *c = '\0';
    c = strrchr(line, ' ');
    if (c == NULL) {
        E_ERROR("Could not find sampling rate!\n");
        rv = -1;
        goto error_out;
    }
    ++c;
    if (ps_config_int(config, "samprate") == 0)
        ps_config_set_int(config, "samprate", atoi(c));
    else if (ps_config_int(config, "samprate") != atoi(c)) {
        E_WARN("NIST file sampling rate %d != samprate %d\n",
               atoi(c), ps_config_int(config, "samprate"));
    }

    if (line + strlen(line) < hdr + 1023)
        line[strlen(line)] = ' ';
    if ((line = strstr(hdr, "sample_byte_format")) == NULL) {
        E_ERROR("No sample byte format in NIST header!\n");
        rv = -1;
        goto error_out;
    }
    c = strchr(line, '\n');
    if (c) *c = '\0';
    c = strrchr(line, ' ');
    if (c == NULL) {
        E_ERROR("Could not find sample byte order!\n");
        rv = -1;
        goto error_out;
    }
    ++c;
    if (0 == memcmp(c, "01", 2)) {
        ps_config_set_str(config, "input_endian", "little");
    }
    else if (0 == memcmp(c, "10", 2)) {
        ps_config_set_str(config, "input_endian", "big");
    }
    else {
        E_ERROR("Unknown byte order %s\n", c);
        rv = -1;
        goto error_out;
    }

error_out:
    return rv;
}